

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall llvm::yaml::Scanner::scanTag(Scanner *this)

{
  uint AtColumn;
  iterator pcVar1;
  byte *pbVar2;
  iterator pcVar3;
  ilist_node_base<false> *piVar4;
  bool bVar5;
  iterator Tok;
  byte *Position;
  byte *pbVar6;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_40 [16];
  
  pcVar1 = this->Current;
  AtColumn = this->Column;
  skip(this,1);
  Position = (byte *)this->Current;
  pbVar2 = (byte *)this->End;
  if ((Position != pbVar2) &&
     ((0x20 < (ulong)*Position || ((0x100002600U >> ((ulong)*Position & 0x3f) & 1) == 0)))) {
    if (*Position == 0x3c) {
      skip(this,1);
      scan_ns_uri_char(this);
      bVar5 = consume(this,0x3e);
      if (!bVar5) {
        return false;
      }
    }
    else {
      do {
        pbVar6 = Position;
        if (((pbVar2 != Position) && (*Position != 9)) && (*Position != 0x20)) {
          pbVar6 = (byte *)skip_nb_char(this,(iterator)Position);
        }
        bVar5 = pbVar6 != Position;
        Position = pbVar6;
      } while (bVar5);
      this->Current = (iterator)pbVar6;
    }
  }
  local_40[0] = 0;
  pcVar3 = this->Current;
  Tok.
  super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
  .I.NodePtr = (iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
                )BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                           (&(this->TokenQueue).
                             super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>,0x48,
                            0x10);
  *(undefined8 *)
   Tok.
   super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
   .I.NodePtr = 0;
  *(undefined8 *)
   ((long)Tok.
          super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
          .I.NodePtr + 8) = 0;
  uStack_60 = SUB84(pcVar1,0);
  uStack_5c = (undefined4)((ulong)pcVar1 >> 0x20);
  *(undefined4 *)
   ((long)Tok.
          super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
          .I.NodePtr + 0x10) = 0x16;
  *(undefined4 *)
   ((long)Tok.
          super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
          .I.NodePtr + 0x14) = uStack_64;
  *(undefined4 *)
   ((long)Tok.
          super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
          .I.NodePtr + 0x18) = uStack_60;
  *(undefined4 *)
   ((long)Tok.
          super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
          .I.NodePtr + 0x1c) = uStack_5c;
  *(long *)((long)Tok.
                  super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
                  .I.NodePtr + 0x20) = (long)pcVar3 - (long)pcVar1;
  *(long *)((long)Tok.
                  super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
                  .I.NodePtr + 0x28) =
       (long)Tok.
             super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
             .I.NodePtr + 0x38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             ((long)Tok.
                    super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
                    .I.NodePtr + 0x28),local_40,local_40);
  piVar4 = (this->TokenQueue).List.Sentinel.
           super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
           .super_node_base_type.Prev;
  *(list_type **)
   ((long)Tok.
          super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
          .I.NodePtr + 8) = &(this->TokenQueue).List;
  *(ilist_node_base<false> **)
   Tok.
   super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
   .I.NodePtr = piVar4;
  piVar4->Next = (ilist_node_base<false> *)
                 Tok.
                 super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
                 .I.NodePtr;
  (this->TokenQueue).List.Sentinel.
  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
  .super_node_base_type.Prev =
       (ilist_node_base<false> *)
       Tok.
       super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
       .I.NodePtr;
  saveSimpleKeyCandidate(this,Tok,AtColumn,false);
  this->IsSimpleKeyAllowed = false;
  return true;
}

Assistant:

bool Scanner::scanTag() {
  StringRef::iterator Start = Current;
  unsigned ColStart = Column;
  skip(1); // Eat !.
  if (Current == End || isBlankOrBreak(Current)); // An empty tag.
  else if (*Current == '<') {
    skip(1);
    scan_ns_uri_char();
    if (!consume('>'))
      return false;
  } else {
    // FIXME: Actually parse the c-ns-shorthand-tag rule.
    Current = skip_while(&Scanner::skip_ns_char, Current);
  }

  Token T;
  T.Kind = Token::TK_Tag;
  T.Range = StringRef(Start, Current - Start);
  TokenQueue.push_back(T);

  // Tags can be simple keys.
  saveSimpleKeyCandidate(--TokenQueue.end(), ColStart, false);

  IsSimpleKeyAllowed = false;

  return true;
}